

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void approx(double *x,double *y,int N,double *xout,double *yout,int Nout)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  double dVar11;
  
  uVar8 = N - 1;
  uVar6 = 0;
  uVar7 = (ulong)(uint)Nout;
  if (Nout < 1) {
    uVar7 = uVar6;
  }
  for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
    dVar1 = xout[uVar6];
    dVar11 = dVar1;
    if (!NAN(dVar1)) {
      if (*x <= dVar1) {
        if (dVar1 < x[(int)uVar8] || dVar1 == x[(int)uVar8]) {
          uVar9 = (ulong)uVar8;
          iVar5 = 0;
          while (iVar10 = iVar5, iVar5 = (int)uVar9, iVar10 < iVar5 + -1) {
            uVar4 = (long)(iVar10 + iVar5) / 2;
            iVar5 = (int)uVar4;
            if (dVar1 < x[iVar5]) {
              uVar9 = uVar4 & 0xffffffff;
              iVar5 = iVar10;
            }
          }
          dVar2 = x[iVar5];
          if ((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) {
            dVar3 = x[iVar10];
            dVar11 = y[iVar10];
            if ((dVar3 != dVar1) || (NAN(dVar3) || NAN(dVar1))) {
              dVar11 = ((dVar1 - dVar3) / (dVar2 - dVar3)) * (y[iVar5] - dVar11) + dVar11;
            }
          }
          else {
            dVar11 = y[iVar5];
          }
        }
        else {
          dVar11 = y[(int)uVar8];
        }
      }
      else {
        dVar11 = *y;
      }
    }
    yout[uVar6] = dVar11;
  }
  return;
}

Assistant:

void approx(double *x,double *y, int N,double *xout, double *yout,int Nout) {
    int i;
	/* x and y should be sorted in ascending order. x has all unique values
		xout contains equally spaced Nout values from lowest x[0]
		to highest x[N-1].Outputs y[out] are Nout interpolated values.
	*/

    for(i = 0; i < Nout;++i) {
        if (xout[i] == xout[i]) {
            yout[i] = interpolate_linear_sorted_ascending(x,y,N,xout[i]);
        } else {
            yout[i] = xout[i];
        }
    }

}